

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_boolean<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  boolean_format_info fmt;
  bool val;
  string str;
  region reg;
  spec *spec;
  region *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  uint in_stack_fffffffffffffb44;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  location *in_stack_fffffffffffffb60;
  location *in_stack_fffffffffffffb70;
  allocator<char> *__a;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this_00;
  region *in_stack_fffffffffffffb98;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 in_stack_fffffffffffffc28;
  string *in_stack_fffffffffffffd90;
  location *in_stack_fffffffffffffd98;
  either *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  allocator<char> local_219 [144];
  allocator<char> local_189 [361];
  spec *local_20;
  
  this_00 = in_RDI;
  local_20 = context<toml::type_config>::toml_spec(in_RDX);
  syntax::boolean((spec *)in_stack_fffffffffffffb98);
  either::scan((either *)in_RDI,in_stack_fffffffffffffb70);
  either::~either((either *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  bVar1 = region::is_ok((region *)0x66ac91);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffffb98);
    bVar1 = parse_boolean<toml::type_config>::anon_class_8_1_ba1d7991::operator()
                      ((anon_class_8_1_ba1d7991 *)in_stack_fffffffffffffb38);
    in_stack_fffffffffffffb44 = (uint)bVar1;
    local_408 = 0;
    uStack_400 = 0;
    local_3f8 = 0;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x66af8d);
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffffb90;
    region::region((region *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb38);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)&stack0xfffffffffffffc18,
               in_stack_fffffffffffffb44 & 1,&local_408,this);
    ok<toml::basic_value<toml::type_config>>
              ((basic_value<toml::type_config> *)in_stack_fffffffffffffc28);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (success_type *)in_stack_fffffffffffffb38);
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x66affc);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    region::~region((region *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  }
  else {
    __a = local_189;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               &in_RDI->is_ok_,__a);
    syntax::boolean((spec *)in_stack_fffffffffffffb98);
    location::location(in_stack_fffffffffffffb60,
                       (location *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               &in_RDI->is_ok_,__a);
    make_syntax_error<toml::detail::either>
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
    err<toml::error_info>((error_info *)in_stack_fffffffffffffb98);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (failure_type *)in_stack_fffffffffffffb38);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66ad88);
    error_info::~error_info
              ((error_info *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::allocator<char>::~allocator(local_219);
    location::~location((location *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    either::~either((either *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::allocator<char>::~allocator((allocator<char> *)local_189);
  }
  region::~region((region *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  return this_00;
}

Assistant:

result<basic_value<TC>, error_info>
parse_boolean(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::boolean(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_boolean: "
            "invalid boolean: boolean must be `true` or `false`, in lowercase. "
            "string must be surrounded by `\"`", syntax::boolean(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();
    const auto val = [&str]() {
        if(str == "true")
        {
            return true;
        }
        else
        {
            assert(str == "false");
            return false;
        }
    }();

    // ----------------------------------------------------------------------
    // no format info for boolean
    boolean_format_info fmt;

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}